

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

objdef * objnew(mcmcxdef *mctx,int sccnt,ushort propspace,objnum *objnptr,int classflg)

{
  undefined8 in_RAX;
  uchar *puVar1;
  mcmon objn;
  objnum local_32;
  
  local_32 = (objnum)((ulong)in_RAX >> 0x30);
  puVar1 = mcmalo0(mctx,propspace + 0xe + (short)sccnt * 2,&local_32,0xffff,0);
  objini(mctx,sccnt,local_32,classflg);
  *objnptr = local_32;
  return puVar1;
}

Assistant:

objdef *objnew(mcmcxdef *mctx, int sccnt, ushort propspace,
               objnum *objnptr, int classflg)
{
    objdef *o;
    mcmon   objn;

    /* allocate cache object */
    o = (objdef *)mcmalo(mctx, (ushort)(OBJDEFSIZ + sccnt * 2 + propspace),
                         &objn);
    
    /* set up object descriptor for the new object */
    objini(mctx, sccnt, (objnum)objn, classflg);

    *objnptr = (objnum)objn;
    return(o);
}